

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_check_curve(mbedtls_ssl_context *ssl,mbedtls_ecp_group_id grp_id)

{
  mbedtls_ecp_group_id mVar1;
  int iVar2;
  mbedtls_ecp_group_id *pmVar3;
  
  pmVar3 = ssl->conf->curve_list;
  iVar2 = -1;
  if (pmVar3 != (mbedtls_ecp_group_id *)0x0) {
    do {
      mVar1 = *pmVar3;
      if (mVar1 == MBEDTLS_ECP_DP_NONE) {
        return -1;
      }
      pmVar3 = pmVar3 + 1;
    } while (mVar1 != grp_id);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_check_curve( const mbedtls_ssl_context *ssl, mbedtls_ecp_group_id grp_id )
{
    const mbedtls_ecp_group_id *gid;

    if( ssl->conf->curve_list == NULL )
        return( -1 );

    for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
        if( *gid == grp_id )
            return( 0 );

    return( -1 );
}